

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

escapeitem_t item_to_escapeitem(item_t item)

{
  item_t item_local;
  escapeitem_t local_4;
  
  switch(item) {
  case '\x03':
    local_4 = 2;
    break;
  default:
    local_4 = 0;
    break;
  case '\x06':
    local_4 = 8;
    break;
  case '\x0e':
    local_4 = 4;
    break;
  case '\x0f':
    local_4 = 1;
  }
  return local_4;
}

Assistant:

escapeitem_t item_to_escapeitem(item_t item)
{
  switch (item)
  {
  case item_COMPASS:
    return escapeitem_COMPASS;
  case item_PAPERS:
    return escapeitem_PAPERS;
  case item_PURSE:
    return escapeitem_PURSE;
  case item_UNIFORM:
    return escapeitem_UNIFORM;
  default:
    return 0;
  }
}